

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_data.cpp
# Opt level: O0

FPropertyInfo * FindProperty(char *string)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  FPropertyInfo **ppFVar4;
  int lexval;
  int mid;
  int max;
  int min;
  char *string_local;
  
  mid = 0;
  uVar1 = TArray<FPropertyInfo_*,_FPropertyInfo_*>::Size(&properties);
  lexval = uVar1 - 1;
  while( true ) {
    if (lexval < mid) {
      return (FPropertyInfo *)0x0;
    }
    iVar2 = (mid + lexval) / 2;
    ppFVar4 = TArray<FPropertyInfo_*,_FPropertyInfo_*>::operator[](&properties,(long)iVar2);
    iVar3 = strcasecmp(string,(*ppFVar4)->name);
    if (iVar3 == 0) break;
    if (iVar3 < 1) {
      lexval = iVar2 + -1;
    }
    else {
      mid = iVar2 + 1;
    }
  }
  ppFVar4 = TArray<FPropertyInfo_*,_FPropertyInfo_*>::operator[](&properties,(long)iVar2);
  return *ppFVar4;
}

Assistant:

FPropertyInfo *FindProperty(const char * string)
{
	int min = 0, max = properties.Size()-1;

	while (min <= max)
	{
		int mid = (min + max) / 2;
		int lexval = stricmp (string, properties[mid]->name);
		if (lexval == 0)
		{
			return properties[mid];
		}
		else if (lexval > 0)
		{
			min = mid + 1;
		}
		else
		{
			max = mid - 1;
		}
	}
	return NULL;
}